

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O3

MarkerType __thiscall
EnrichableAnalyzerSubprocess::GetMarkerType
          (EnrichableAnalyzerSubprocess *this,char *buffer,uint bufferLength)

{
  int iVar1;
  MarkerType MVar2;
  size_t __n;
  
  __n = strlen(buffer);
  iVar1 = strncmp(buffer,"ErrorDot",__n);
  if (iVar1 == 0) {
    MVar2 = ErrorDot;
  }
  else {
    iVar1 = strncmp(buffer,"Square",__n);
    if (iVar1 == 0) {
      MVar2 = Square;
    }
    else {
      iVar1 = strncmp(buffer,"ErrorSquare",__n);
      if (iVar1 == 0) {
        MVar2 = ErrorSquare;
      }
      else {
        iVar1 = strncmp(buffer,"UpArrow",__n);
        if (iVar1 == 0) {
          MVar2 = UpArrow;
        }
        else {
          iVar1 = strncmp(buffer,"DownArrow",__n);
          if (iVar1 == 0) {
            MVar2 = DownArrow;
          }
          else {
            iVar1 = strncmp(buffer,"X",__n);
            if (iVar1 == 0) {
              MVar2 = X;
            }
            else {
              iVar1 = strncmp(buffer,"ErrorX",__n);
              if (iVar1 == 0) {
                MVar2 = ErrorX;
              }
              else {
                iVar1 = strncmp(buffer,"Start",__n);
                if (iVar1 == 0) {
                  MVar2 = Start;
                }
                else {
                  iVar1 = strncmp(buffer,"Stop",__n);
                  if (iVar1 == 0) {
                    MVar2 = Stop;
                  }
                  else {
                    iVar1 = strncmp(buffer,"One",__n);
                    if (iVar1 == 0) {
                      MVar2 = One;
                    }
                    else {
                      iVar1 = strncmp(buffer,"Zero",__n);
                      MVar2 = Zero;
                      if (iVar1 != 0) {
                        MVar2 = Dot;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return MVar2;
}

Assistant:

AnalyzerResults::MarkerType EnrichableAnalyzerSubprocess::GetMarkerType(char* buffer, unsigned bufferLength) {
	AnalyzerResults::MarkerType markerType = AnalyzerResults::Dot;

	if(strncmp(buffer, "ErrorDot", strlen(buffer)) == 0) {
		markerType = AnalyzerResults::ErrorDot;
	} else if(strncmp(buffer, "Square", strlen(buffer)) == 0) {
		markerType = AnalyzerResults::Square;
	} else if(strncmp(buffer, "ErrorSquare", strlen(buffer)) == 0) {
		markerType = AnalyzerResults::ErrorSquare;
	} else if(strncmp(buffer, "UpArrow", strlen(buffer)) == 0) {
		markerType = AnalyzerResults::UpArrow;
	} else if(strncmp(buffer, "DownArrow", strlen(buffer)) == 0) {
		markerType = AnalyzerResults::DownArrow;
	} else if(strncmp(buffer, "X", strlen(buffer)) == 0) {
		markerType = AnalyzerResults::X;
	} else if(strncmp(buffer, "ErrorX", strlen(buffer)) == 0) {
		markerType = AnalyzerResults::ErrorX;
	} else if(strncmp(buffer, "Start", strlen(buffer)) == 0) {
		markerType = AnalyzerResults::Start;
	} else if(strncmp(buffer, "Stop", strlen(buffer)) == 0) {
		markerType = AnalyzerResults::Stop;
	} else if(strncmp(buffer, "One", strlen(buffer)) == 0) {
		markerType = AnalyzerResults::One;
	} else if(strncmp(buffer, "Zero", strlen(buffer)) == 0) {
		markerType = AnalyzerResults::Zero;
	} else if(strncmp(buffer, "Dot", strlen(buffer)) == 0) {
		markerType = AnalyzerResults::Dot;
	}

	return markerType;
}